

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.c
# Opt level: O0

void BrotliEncodeMlen(size_t length,uint64_t *bits,size_t *numbits,uint64_t *nibblesbits)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  ulong local_50;
  uint local_44;
  size_t mnibbles;
  size_t lg;
  uint64_t *nibblesbits_local;
  size_t *numbits_local;
  uint64_t *bits_local;
  size_t length_local;
  
  if (length == 1) {
    local_44 = 1;
  }
  else {
    uVar2 = (int)length - 1;
    iVar1 = 0x1f;
    if (uVar2 != 0) {
      for (; uVar2 >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    local_44 = iVar1 + 1;
  }
  uVar3 = (ulong)local_44;
  if (uVar3 < 0x10) {
    local_50 = 0x10;
  }
  else {
    local_50 = uVar3 + 3;
  }
  if (length == 0) {
    __assert_fail("length > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/brotli_bit_stream.c"
                  ,0x5c,"void BrotliEncodeMlen(size_t, uint64_t *, size_t *, uint64_t *)");
  }
  if (0x1000000 < length) {
    __assert_fail("length <= (1 << 24)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/brotli_bit_stream.c"
                  ,0x5d,"void BrotliEncodeMlen(size_t, uint64_t *, size_t *, uint64_t *)");
  }
  if (uVar3 < 0x19) {
    *nibblesbits = (local_50 >> 2) - 4;
    *numbits = (local_50 >> 2) << 2;
    *bits = length - 1;
    return;
  }
  __assert_fail("lg <= 24",
                "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/brotli_bit_stream.c"
                ,0x5e,"void BrotliEncodeMlen(size_t, uint64_t *, size_t *, uint64_t *)");
}

Assistant:

static void BrotliEncodeMlen(size_t length, uint64_t* bits,
                             size_t* numbits, uint64_t* nibblesbits) {
  size_t lg = (length == 1) ? 1 : Log2FloorNonZero((uint32_t)(length - 1)) + 1;
  size_t mnibbles = (lg < 16 ? 16 : (lg + 3)) / 4;
  assert(length > 0);
  assert(length <= (1 << 24));
  assert(lg <= 24);
  *nibblesbits = mnibbles - 4;
  *numbits = mnibbles * 4;
  *bits = length - 1;
}